

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O3

DdNode * Cudd_IndicesToCube(DdManager *dd,int *array,int n)

{
  DdNode *pDVar1;
  ulong uVar2;
  ulong uVar3;
  DdNode *g;
  
  pDVar1 = dd->one;
  uVar2 = (ulong)pDVar1 & 0xfffffffffffffffe;
  *(int *)(uVar2 + 4) = *(int *)(uVar2 + 4) + 1;
  if (0 < n) {
    uVar3 = (ulong)(uint)n + 1;
    g = pDVar1;
    do {
      pDVar1 = Cudd_bddIthVar(dd,array[uVar3 - 2]);
      pDVar1 = Cudd_bddAnd(dd,pDVar1,g);
      if (pDVar1 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,g);
        return (DdNode *)0x0;
      }
      uVar2 = (ulong)pDVar1 & 0xfffffffffffffffe;
      *(int *)(uVar2 + 4) = *(int *)(uVar2 + 4) + 1;
      Cudd_RecursiveDeref(dd,g);
      uVar3 = uVar3 - 1;
      g = pDVar1;
    } while (1 < uVar3);
  }
  *(int *)(uVar2 + 4) = *(int *)(uVar2 + 4) + -1;
  return pDVar1;
}

Assistant:

DdNode *
Cudd_IndicesToCube(
  DdManager * dd,
  int * array,
  int  n)
{
    DdNode *cube, *tmp;
    int i;

    cube = DD_ONE(dd);
    cuddRef(cube);
    for (i = n - 1; i >= 0; i--) {
        tmp = Cudd_bddAnd(dd,Cudd_bddIthVar(dd,array[i]),cube);
        if (tmp == NULL) {
            Cudd_RecursiveDeref(dd,cube);
            return(NULL);
        }
        cuddRef(tmp);
        Cudd_RecursiveDeref(dd,cube);
        cube = tmp;
    }

    cuddDeref(cube);
    return(cube);

}